

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonException.h
# Opt level: O0

void __thiscall Json::JsonException::escape_rs(JsonException *this,string *s)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  ulong local_60;
  size_t i;
  string w;
  string v;
  string *s_local;
  JsonException *this_local;
  
  std::__cxx11::string::string((string *)(w.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&i);
  for (local_60 = 0; uVar2 = std::__cxx11::string::size(), local_60 < uVar2; local_60 = local_60 + 1
      ) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
    if (*pcVar3 == '\\') {
      std::__cxx11::string::operator+=((string *)(w.field_2._M_local_buf + 8),"\\");
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
      bVar1 = JsonString::is_escape(*pcVar3,(string *)&i);
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)(w.field_2._M_local_buf + 8),(string *)&i);
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
        std::__cxx11::string::operator+=((string *)(w.field_2._M_local_buf + 8),*pcVar3);
      }
    }
  }
  std::__cxx11::string::operator=((string *)s,(string *)(w.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::~string((string *)(w.field_2._M_local_buf + 8));
  return;
}

Assistant:

void escape_rs(std::string &s) const {
            std::string v, w;
            for (size_t i = 0; i < s.size(); ++i)
                if (s[i] == '\\') v += "\\";
                else if (JsonString::is_escape(s[i], w)) v += w;
                else v += s[i];
            s = v;
        }